

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts3GetVarint(char *pBuf,sqlite_int64 *v)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  cVar1 = *pBuf;
  if (-1 < (long)cVar1) {
    *v = (long)cVar1;
    return 1;
  }
  uVar2 = (uint)(byte)pBuf[1] << 7;
  if (-1 < pBuf[1]) {
    *v = (ulong)(uVar2 | (int)cVar1 & 0x7fU);
    return 2;
  }
  uVar2 = uVar2 & 0x3fff | (int)cVar1 & 0x7fU;
  uVar5 = (uint)(byte)pBuf[2] << 0xe;
  if (-1 < pBuf[2]) {
    *v = (ulong)(uVar5 | uVar2);
    return 3;
  }
  uVar2 = uVar5 & 0x1fffff | uVar2;
  uVar5 = (uint)(byte)pBuf[3] << 0x15;
  if (-1 < pBuf[3]) {
    *v = (ulong)(uVar5 | uVar2);
    return 4;
  }
  uVar6 = (ulong)(uVar5 & 0xfffffff | uVar2);
  pcVar3 = pBuf + 5;
  uVar7 = 0x15;
  do {
    uVar6 = ((ulong)((byte)pcVar3[-1] & 0x7f) << ((char)uVar7 + 7U & 0x3f)) + uVar6;
    pcVar4 = pcVar3;
    if (-1 < pcVar3[-1]) break;
    uVar7 = uVar7 + 7;
    pcVar3 = pcVar3 + 1;
    pcVar4 = pBuf + 10;
  } while (uVar7 < 0x39);
  *v = uVar6;
  return (int)pcVar4 - (int)pBuf;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3GetVarint(const char *pBuf, sqlite_int64 *v){
  const unsigned char *p = (const unsigned char*)pBuf;
  const unsigned char *pStart = p;
  u32 a;
  u64 b;
  int shift;

  GETVARINT_INIT(a, p, 0,  0x00,     0x80, *v, 1);
  GETVARINT_STEP(a, p, 7,  0x7F,     0x4000, *v, 2);
  GETVARINT_STEP(a, p, 14, 0x3FFF,   0x200000, *v, 3);
  GETVARINT_STEP(a, p, 21, 0x1FFFFF, 0x10000000, *v, 4);
  b = (a & 0x0FFFFFFF );

  for(shift=28; shift<=63; shift+=7){
    u64 c = *p++;
    b += (c&0x7F) << shift;
    if( (c & 0x80)==0 ) break;
  }
  *v = b;
  return (int)(p - pStart);
}